

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateFramework(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  bool bVar3;
  iterator iVar4;
  allocator local_141;
  string newName;
  string oldName;
  key_type local_100;
  string frameworkVersion;
  string name;
  string plist;
  string newoutpath;
  string contentdir;
  string versions;
  
  bVar3 = MustSkip(this);
  if (!bVar3) {
    if (this->MacContentFolders ==
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __assert_fail("this->MacContentFolders",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmOSXBundleGenerator.cxx"
                    ,0x4c,
                    "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &)"
                   );
    }
    std::operator+(&newoutpath,outpath,"/");
    cmGeneratorTarget::GetFrameworkDirectory(&frameworkVersion,this->GT,&this->ConfigName,true);
    std::operator+(&contentdir,&newoutpath,&frameworkVersion);
    std::__cxx11::string::~string((string *)&frameworkVersion);
    std::__cxx11::string::~string((string *)&newoutpath);
    std::__cxx11::string::append((char *)&contentdir);
    std::operator+(&frameworkVersion,outpath,"/");
    cmGeneratorTarget::GetFrameworkDirectory(&plist,this->GT,&this->ConfigName,false);
    std::operator+(&newoutpath,&frameworkVersion,&plist);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&frameworkVersion);
    cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_(&frameworkVersion,this->GT);
    std::__cxx11::string::string((string *)&plist,(string *)&newoutpath);
    bVar3 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    if (!bVar3) {
      this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)this->MacContentFolders;
      std::__cxx11::string::string((string *)&name,"Resources",(allocator *)&oldName);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>(this_00,&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::append((char *)&plist);
    }
    std::__cxx11::string::append((char *)&plist);
    cmsys::SystemTools::GetFilenameName(&name,targetName);
    cmLocalGenerator::GenerateFrameworkInfoPList
              (this->LocalGenerator,this->GT,&name,plist._M_dataplus._M_p);
    bVar3 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    if (!bVar3) {
      oldName._M_dataplus._M_p = (pointer)&oldName.field_2;
      oldName._M_string_length = 0;
      oldName.field_2._M_local_buf[0] = '\0';
      newName._M_dataplus._M_p = (pointer)&newName.field_2;
      newName._M_string_length = 0;
      newName.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&versions,(string *)&contentdir);
      std::__cxx11::string::append((char *)&versions);
      cmsys::SystemTools::MakeDirectory(versions._M_dataplus._M_p);
      cmsys::SystemTools::MakeDirectory(newoutpath._M_dataplus._M_p);
      std::__cxx11::string::_M_assign((string *)&oldName);
      std::__cxx11::string::_M_assign((string *)&newName);
      std::__cxx11::string::append((char *)&newName);
      cmsys::SystemTools::RemoveFile(&newName);
      cmsys::SystemTools::CreateSymlink(&oldName,&newName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&newName);
      std::__cxx11::string::assign((char *)&oldName);
      std::__cxx11::string::append((string *)&oldName);
      std::__cxx11::string::_M_assign((string *)&newName);
      std::__cxx11::string::append((string *)&newName);
      cmsys::SystemTools::RemoveFile(&newName);
      cmsys::SystemTools::CreateSymlink(&oldName,&newName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Makefile->OutputFiles,&newName);
      p_Var1 = &this->MacContentFolders->_M_t;
      std::__cxx11::string::string((string *)&local_100,"Resources",&local_141);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(p_Var1,&local_100);
      psVar2 = this->MacContentFolders;
      std::__cxx11::string::~string((string *)&local_100);
      if ((_Rb_tree_header *)iVar4._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::assign((char *)&oldName);
        std::__cxx11::string::_M_assign((string *)&newName);
        std::__cxx11::string::append((char *)&newName);
        cmsys::SystemTools::RemoveFile(&newName);
        cmsys::SystemTools::CreateSymlink(&oldName,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Makefile->OutputFiles,&newName);
      }
      p_Var1 = &this->MacContentFolders->_M_t;
      std::__cxx11::string::string((string *)&local_100,"Headers",&local_141);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(p_Var1,&local_100);
      psVar2 = this->MacContentFolders;
      std::__cxx11::string::~string((string *)&local_100);
      if ((_Rb_tree_header *)iVar4._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::assign((char *)&oldName);
        std::__cxx11::string::_M_assign((string *)&newName);
        std::__cxx11::string::append((char *)&newName);
        cmsys::SystemTools::RemoveFile(&newName);
        cmsys::SystemTools::CreateSymlink(&oldName,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Makefile->OutputFiles,&newName);
      }
      p_Var1 = &this->MacContentFolders->_M_t;
      std::__cxx11::string::string((string *)&local_100,"PrivateHeaders",&local_141);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(p_Var1,&local_100);
      psVar2 = this->MacContentFolders;
      std::__cxx11::string::~string((string *)&local_100);
      if ((_Rb_tree_header *)iVar4._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::assign((char *)&oldName);
        std::__cxx11::string::_M_assign((string *)&newName);
        std::__cxx11::string::append((char *)&newName);
        cmsys::SystemTools::RemoveFile(&newName);
        cmsys::SystemTools::CreateSymlink(&oldName,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Makefile->OutputFiles,&newName);
      }
      std::__cxx11::string::~string((string *)&versions);
      std::__cxx11::string::~string((string *)&newName);
      std::__cxx11::string::~string((string *)&oldName);
    }
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&frameworkVersion);
    std::__cxx11::string::~string((string *)&newoutpath);
    std::__cxx11::string::~string((string *)&contentdir);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(
  const std::string& targetName, const std::string& outpath)
{
  if (this->MustSkip())
    return;

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = outpath + "/" +
    this->GT->GetFrameworkDirectory(this->ConfigName, true);
  contentdir += "/";

  std::string newoutpath = outpath + "/" +
    this->GT->GetFrameworkDirectory(this->ConfigName, false);

  std::string frameworkVersion = this->GT->GetFrameworkVersion();

  // Configure the Info.plist file
  std::string plist = newoutpath;
  if (!this->Makefile->PlatformIsAppleIos())
    {
    // Put the Info.plist file into the Resources directory.
    this->MacContentFolders->insert("Resources");
    plist += "/Resources";
    }
  plist += "/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateFrameworkInfoPList(this->GT,
                                                   name,
                                                   plist.c_str());

  // Generate Versions directory only for MacOSX frameworks
  if (this->Makefile->PlatformIsAppleIos())
    return;

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;


  // Make foo.framework/Versions
  std::string versions = contentdir;
  versions += "Versions";
  cmSystemTools::MakeDirectory(versions.c_str());

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath.c_str());

  // Current -> version
  oldName = frameworkVersion;
  newName = versions;
  newName += "/Current";
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = "Versions/Current/";
  oldName += name;
  newName = contentdir;
  newName += name;
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if(this->MacContentFolders->find("Resources") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/Resources";
    newName = contentdir;
    newName += "Resources";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }

  // Headers -> Versions/Current/Headers
  if(this->MacContentFolders->find("Headers") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/Headers";
    newName = contentdir;
    newName += "Headers";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if(this->MacContentFolders->find("PrivateHeaders") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/PrivateHeaders";
    newName = contentdir;
    newName += "PrivateHeaders";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }
}